

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void ddst(int n,int isgn,double *a,int *ip,double *w)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int nw;
  int nc;
  double dVar6;
  
  uVar3 = (ulong)(uint)n;
  nw = *ip;
  if (nw * 4 < n) {
    nw = n >> 2;
    makewt(nw,ip,w);
  }
  nc = ip[1];
  if (ip[1] < n) {
    makect(n,ip,w + nw);
    nc = n;
  }
  if (isgn < 0) {
    dVar6 = a[(long)n + -1];
    if (n < 4) {
      a[1] = dVar6 + *a;
      *a = *a - dVar6;
    }
    else {
      uVar3 = uVar3 + 2;
      do {
        dVar1 = a[uVar3 - 5];
        dVar2 = a[uVar3 - 4];
        a[uVar3 - 4] = dVar2 - dVar1;
        (a + (uVar3 - 4))[1] = -dVar2 - dVar1;
        uVar3 = uVar3 - 2;
      } while (5 < uVar3);
      a[1] = dVar6 + *a;
      *a = *a - dVar6;
      if (n == 4) {
        cftfsub(4,a,w);
      }
      else {
        rftbsub(n,a,nc,w + nw);
        bitrv2(n,ip + 2,a);
        cftbsub(n,a,w);
      }
    }
    dstsub(n,a,nc,w + nw);
    return;
  }
  dstsub(n,a,nc,w + nw);
  if (n < 5) {
    if (n == 4) {
      cftfsub(4,a,w);
      goto LAB_0010b19d;
    }
    dVar6 = *a - a[1];
    *a = *a + a[1];
    if (n < 3) {
      uVar3 = (ulong)n;
      goto LAB_0010b1f9;
    }
  }
  else {
    bitrv2(n,ip + 2,a);
    cftfsub(n,a,w);
    rftfsub(n,a,nc,w + nw);
LAB_0010b19d:
    dVar6 = *a - a[1];
    *a = *a + a[1];
  }
  lVar4 = 3;
  do {
    a[lVar4 + -2] = -a[lVar4 + -1] - a[lVar4];
    (a + lVar4 + -2)[1] = a[lVar4 + -1] - a[lVar4];
    uVar5 = lVar4 + 1;
    lVar4 = lVar4 + 2;
  } while (uVar5 < uVar3);
LAB_0010b1f9:
  a[uVar3 - 1] = -dVar6;
  return;
}

Assistant:

void ddst(int n, int isgn, double *a, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void cftbsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void rftbsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, nw, nc;
    double xr;
    
    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > nc) {
        nc = n;
        makect(nc, ip, w + nw);
    }
    if (isgn < 0) {
        xr = a[n - 1];
        for (j = n - 2; j >= 2; j -= 2) {
            a[j + 1] = -a[j] - a[j - 1];
            a[j] -= a[j - 1];
        }
        a[1] = a[0] + xr;
        a[0] -= xr;
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
    dstsub(n, a, nc, w + nw);
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xr = a[0] - a[1];
        a[0] += a[1];
        for (j = 2; j < n; j += 2) {
            a[j - 1] = -a[j] - a[j + 1];
            a[j] -= a[j + 1];
        }
        a[n - 1] = -xr;
    }
}